

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  MixSegment *this;
  pointer pbVar1;
  pointer pbVar2;
  ostream *poVar3;
  long lVar4;
  undefined8 *puVar5;
  char (*pacVar6) [32];
  string *connector;
  pointer str;
  byte bVar7;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tagres;
  allocator<char> local_83a;
  allocator<char> local_839;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string s;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  LookupTagres;
  char DemoTokens [4] [32];
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> jiebawords;
  vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  keywordres;
  string result;
  Jieba jieba;
  
  bVar7 = 0;
  connector = (string *)&tagres;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)DemoTokens,"../dict/jieba.dict.utf8",(allocator<char> *)&jiebawords);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"../dict/hmm_model.utf8",(allocator<char> *)&LookupTagres);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"../dict/user.dict.utf8",(allocator<char> *)&keywordres);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tagres,"../dict/idf.utf8",&local_839);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&words,"../dict/stop_words.utf8",&local_83a);
  cppjieba::Jieba::Jieba(&jieba,(string *)DemoTokens,&s,&result,(string *)&tagres,(string *)&words);
  std::__cxx11::string::~string((string *)&words);
  std::__cxx11::string::~string((string *)&tagres);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string((string *)DemoTokens);
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  jiebawords.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  jiebawords.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  jiebawords.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&s);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&s);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"[demo] Cut With HMM");
  std::endl<char,std::char_traits<char>>(poVar3);
  this = &jieba.mix_seg_;
  cppjieba::MixSegment::Cut(this,&s,&words,true);
  pbVar2 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tagres,"/",(allocator<char> *)&LookupTagres);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)DemoTokens,(limonp *)pbVar1,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tagres,
             connector);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)DemoTokens);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)DemoTokens);
  std::__cxx11::string::~string((string *)&tagres);
  poVar3 = std::operator<<((ostream *)&std::cout,"[demo] Cut Without HMM ");
  std::endl<char,std::char_traits<char>>(poVar3);
  cppjieba::MixSegment::Cut(this,&s,&words,false);
  pbVar2 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tagres,"/",(allocator<char> *)&LookupTagres);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)DemoTokens,(limonp *)pbVar1,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tagres,
             connector);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)DemoTokens);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)DemoTokens);
  std::__cxx11::string::~string((string *)&tagres);
  std::__cxx11::string::assign((char *)&s);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&s);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"[demo] CutAll");
  std::endl<char,std::char_traits<char>>(poVar3);
  cppjieba::FullSegment::Cut(&jieba.full_seg_,&s,&words);
  pbVar2 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tagres,"/",(allocator<char> *)&LookupTagres);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)DemoTokens,(limonp *)pbVar1,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tagres,
             connector);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)DemoTokens);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)DemoTokens);
  std::__cxx11::string::~string((string *)&tagres);
  std::__cxx11::string::assign((char *)&s);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&s);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"[demo] CutForSearch");
  std::endl<char,std::char_traits<char>>(poVar3);
  cppjieba::QuerySegment::Cut(&jieba.query_seg_,&s,&words,true);
  pbVar2 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tagres,"/",(allocator<char> *)&LookupTagres);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)DemoTokens,(limonp *)pbVar1,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tagres,
             connector);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)DemoTokens);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)DemoTokens);
  std::__cxx11::string::~string((string *)&tagres);
  poVar3 = std::operator<<((ostream *)&std::cout,"[demo] Insert User Word");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)DemoTokens,anon_var_dwarf_1ddd3,(allocator<char> *)&tagres);
  cppjieba::MixSegment::Cut(this,(string *)DemoTokens,&words,true);
  std::__cxx11::string::~string((string *)DemoTokens);
  pbVar2 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tagres,"/",(allocator<char> *)&LookupTagres);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)DemoTokens,(limonp *)pbVar1,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tagres,
             connector);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)DemoTokens);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)DemoTokens);
  std::__cxx11::string::~string((string *)&tagres);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)DemoTokens,anon_var_dwarf_1ddd3,(allocator<char> *)&LookupTagres);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tagres,"",(allocator<char> *)&keywordres);
  cppjieba::DictTrie::InsertUserWord(&jieba.dict_trie_,(string *)DemoTokens,(string *)&tagres);
  std::__cxx11::string::~string((string *)&tagres);
  std::__cxx11::string::~string((string *)DemoTokens);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)DemoTokens,anon_var_dwarf_1ddd3,(allocator<char> *)&tagres);
  cppjieba::MixSegment::Cut(this,(string *)DemoTokens,&words,true);
  std::__cxx11::string::~string((string *)DemoTokens);
  pbVar2 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tagres,"/",(allocator<char> *)&LookupTagres);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)DemoTokens,(limonp *)pbVar1,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tagres,
             connector);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)DemoTokens);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)DemoTokens);
  std::__cxx11::string::~string((string *)&tagres);
  poVar3 = std::operator<<((ostream *)&std::cout,"[demo] CutForSearch Word With Offset");
  std::endl<char,std::char_traits<char>>(poVar3);
  cppjieba::QuerySegment::Cut(&jieba.query_seg_,&s,&jiebawords,true);
  poVar3 = std::operator<<((ostream *)&std::cout,&jiebawords);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"[demo] Lookup Tag for Single Token");
  std::endl<char,std::char_traits<char>>(poVar3);
  puVar5 = &DAT_00122620;
  pacVar6 = DemoTokens;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)*pacVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    pacVar6 = (char (*) [32])((long)pacVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&LookupTagres,4,(allocator_type *)&tagres);
  for (str = LookupTagres.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      str != LookupTagres.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; str = str + 1) {
    std::__cxx11::string::assign((char *)str);
    cppjieba::MixSegment::LookupTag((string *)&tagres,this,&str->first);
    std::__cxx11::string::operator=((string *)&str->second,(string *)&tagres);
    std::__cxx11::string::~string((string *)&tagres);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,&LookupTagres);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"[demo] Tagging");
  std::endl<char,std::char_traits<char>>(poVar3);
  tagres.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tagres.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tagres.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::assign((char *)&s);
  cppjieba::MixSegment::Tag(this,&s,&tagres);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&s);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,&tagres);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"[demo] Keyword Extraction");
  std::endl<char,std::char_traits<char>>(poVar3);
  keywordres.
  super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keywordres.
  super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  keywordres.
  super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cppjieba::KeywordExtractor::Extract(&jieba.extractor,&s,&keywordres,5);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&s);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,&keywordres);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>::
  ~vector(&keywordres);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&tagres);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&LookupTagres);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&s);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::~vector(&jiebawords);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&words);
  cppjieba::Jieba::~Jieba(&jieba);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  cppjieba::Jieba jieba(DICT_PATH,
        HMM_PATH,
        USER_DICT_PATH,
        IDF_PATH,
        STOP_WORD_PATH);
  vector<string> words;
  vector<cppjieba::Word> jiebawords;
  string s;
  string result;

  s = "他来到了网易杭研大厦";
  cout << s << endl;
  cout << "[demo] Cut With HMM" << endl;
  jieba.Cut(s, words, true);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  cout << "[demo] Cut Without HMM " << endl;
  jieba.Cut(s, words, false);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  s = "我来到北京清华大学";
  cout << s << endl;
  cout << "[demo] CutAll" << endl;
  jieba.CutAll(s, words);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  s = "小明硕士毕业于中国科学院计算所，后在日本京都大学深造";
  cout << s << endl;
  cout << "[demo] CutForSearch" << endl;
  jieba.CutForSearch(s, words);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  cout << "[demo] Insert User Word" << endl;
  jieba.Cut("男默女泪", words);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;
  jieba.InsertUserWord("男默女泪");
  jieba.Cut("男默女泪", words);
  cout << limonp::Join(words.begin(), words.end(), "/") << endl;

  cout << "[demo] CutForSearch Word With Offset" << endl;
  jieba.CutForSearch(s, jiebawords, true);
  cout << jiebawords << endl;

  cout << "[demo] Lookup Tag for Single Token" << endl;
  const int DemoTokenMaxLen = 32;
  char DemoTokens[][DemoTokenMaxLen] = {"拖拉机", "CEO", "123", "。"};
  vector<pair<string, string> > LookupTagres(sizeof(DemoTokens) / DemoTokenMaxLen);
  vector<pair<string, string> >::iterator it;
  for (it = LookupTagres.begin(); it != LookupTagres.end(); it++) {
	it->first = DemoTokens[it - LookupTagres.begin()];
	it->second = jieba.LookupTag(it->first);
  }
  cout << LookupTagres << endl;

  cout << "[demo] Tagging" << endl;
  vector<pair<string, string> > tagres;
  s = "我是拖拉机学院手扶拖拉机专业的。不用多久，我就会升职加薪，当上CEO，走上人生巅峰。";
  jieba.Tag(s, tagres);
  cout << s << endl;
  cout << tagres << endl;

  cout << "[demo] Keyword Extraction" << endl;
  const size_t topk = 5;
  vector<cppjieba::KeywordExtractor::Word> keywordres;
  jieba.extractor.Extract(s, keywordres, topk);
  cout << s << endl;
  cout << keywordres << endl;
  return EXIT_SUCCESS;
}